

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListView::setMovement(QListView *this,Movement movement)

{
  QListViewPrivate *pQVar1;
  Movement in_ESI;
  undefined8 in_RDI;
  undefined1 uVar2;
  bool movable;
  QListViewPrivate *d;
  undefined1 enable;
  undefined7 in_stack_ffffffffffffffe0;
  int delay;
  undefined4 in_stack_fffffffffffffff0;
  
  enable = (undefined1)((ulong)in_RDI >> 0x38);
  pQVar1 = d_func((QListView *)0x87694f);
  pQVar1->field_0x56c = pQVar1->field_0x56c | 0x10;
  pQVar1->movement = in_ESI;
  uVar2 = in_ESI != Static;
  QAbstractItemView::setDragEnabled
            ((QAbstractItemView *)CONCAT17(uVar2,in_stack_ffffffffffffffe0),(bool)enable);
  delay = (int)((ulong)pQVar1 >> 0x20);
  QWidget::setAcceptDrops((QWidget *)CONCAT17(uVar2,in_stack_ffffffffffffffe0),(bool)enable);
  QAbstractItemViewPrivate::doDelayedItemsLayout
            ((QAbstractItemViewPrivate *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),delay);
  return;
}

Assistant:

void QListView::setMovement(Movement movement)
{
    Q_D(QListView);
    d->modeProperties |= uint(QListViewPrivate::Movement);
    d->movement = movement;

#if QT_CONFIG(draganddrop)
    bool movable = (movement != Static);
    setDragEnabled(movable);
    d->viewport->setAcceptDrops(movable);
#endif
    d->doDelayedItemsLayout();
}